

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool testing::internal::
     MatchPrintAndExplain<phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>const,phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>const&>
               (node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
                *value,Matcher<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
                       *matcher,MatchResultListener *listener)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int> *value_00;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [11];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  MatchResultListener *pMVar21;
  bool bVar22;
  ostream *poVar23;
  uint uVar24;
  type_info *type;
  char *pcVar25;
  slot_type *pptVar26;
  long lVar27;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  StringMatchResultListener inner_listener;
  string local_210;
  MatchResultListener *local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  MatchResultListener local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (listener->stream_ == (ostream *)0x0) {
    local_1c8.stream_ = (ostream *)0x0;
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00208958;
    bVar22 = MatcherBase<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
             ::MatchAndExplain(&matcher->
                                super_MatcherBase<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
                               ,value,&local_1c8);
  }
  else {
    local_1c8.stream_ = local_1a8;
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_002089b0;
    local_1f0 = listener;
    std::__cxx11::stringstream::stringstream(local_1b8);
    bVar22 = MatcherBase<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
             ::MatchAndExplain(&matcher->
                                super_MatcherBase<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
                               ,value,&local_1c8);
    poVar23 = local_1f0->stream_;
    local_210._M_dataplus._M_p._0_1_ = 0x7b;
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,(char *)&local_210,1);
    pcVar2 = (value->
             super_raw_hash_map<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
             ).
             super_raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
             .ctrl_;
    pptVar26 = (value->
               super_raw_hash_map<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
               ).
               super_raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
               .slots_;
    cVar1 = *pcVar2;
    pcVar25 = pcVar2;
    while (cVar1 < -1) {
      iVar9 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                     CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar25 < (char)iVar9);
      in_XMM1_Bb = -(pcVar25[1] < (char)((uint)iVar9 >> 8));
      in_XMM1_Bc = -(pcVar25[2] < (char)((uint)iVar9 >> 0x10));
      in_XMM1_Bd = -(pcVar25[3] < (char)((uint)iVar9 >> 0x18));
      in_XMM1_Be = -(pcVar25[4] < (char)iVar10);
      in_XMM1_Bf = -(pcVar25[5] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bg = -(pcVar25[6] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bh = -(pcVar25[7] < (char)((uint)iVar10 >> 0x18));
      in_XMM1_Bi = -(pcVar25[8] < (char)iVar11);
      in_XMM1_Bj = -(pcVar25[9] < (char)((uint)iVar11 >> 8));
      in_XMM1_Bk = -(pcVar25[10] < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bl = -(pcVar25[0xb] < (char)((uint)iVar11 >> 0x18));
      in_XMM1_Bm = -(pcVar25[0xc] < (char)iVar12);
      in_XMM1_Bn = -(pcVar25[0xd] < (char)((uint)iVar12 >> 8));
      in_XMM1_Bo = -(pcVar25[0xe] < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bp = -(pcVar25[0xf] < (char)((uint)iVar12 >> 0x18));
      auVar5[1] = in_XMM1_Bb;
      auVar5[0] = in_XMM1_Ba;
      auVar5[2] = in_XMM1_Bc;
      auVar5[3] = in_XMM1_Bd;
      auVar5[4] = in_XMM1_Be;
      auVar5[5] = in_XMM1_Bf;
      auVar5[6] = in_XMM1_Bg;
      auVar5[7] = in_XMM1_Bh;
      auVar5[8] = in_XMM1_Bi;
      auVar5[9] = in_XMM1_Bj;
      auVar5[10] = in_XMM1_Bk;
      auVar5[0xb] = in_XMM1_Bl;
      auVar5[0xc] = in_XMM1_Bm;
      auVar5[0xd] = in_XMM1_Bn;
      auVar5[0xe] = in_XMM1_Bo;
      auVar5[0xf] = in_XMM1_Bp;
      auVar6[1] = in_XMM1_Bb;
      auVar6[0] = in_XMM1_Ba;
      auVar6[2] = in_XMM1_Bc;
      auVar6[3] = in_XMM1_Bd;
      auVar6[4] = in_XMM1_Be;
      auVar6[5] = in_XMM1_Bf;
      auVar6[6] = in_XMM1_Bg;
      auVar6[7] = in_XMM1_Bh;
      auVar6[8] = in_XMM1_Bi;
      auVar6[9] = in_XMM1_Bj;
      auVar6[10] = in_XMM1_Bk;
      auVar6[0xb] = in_XMM1_Bl;
      auVar6[0xc] = in_XMM1_Bm;
      auVar6[0xd] = in_XMM1_Bn;
      auVar6[0xe] = in_XMM1_Bo;
      auVar6[0xf] = in_XMM1_Bp;
      auVar19[1] = in_XMM1_Bd;
      auVar19[0] = in_XMM1_Bc;
      auVar19[2] = in_XMM1_Be;
      auVar19[3] = in_XMM1_Bf;
      auVar19[4] = in_XMM1_Bg;
      auVar19[5] = in_XMM1_Bh;
      auVar19[6] = in_XMM1_Bi;
      auVar19[7] = in_XMM1_Bj;
      auVar19[8] = in_XMM1_Bk;
      auVar19[9] = in_XMM1_Bl;
      auVar19[10] = in_XMM1_Bm;
      auVar19[0xb] = in_XMM1_Bn;
      auVar19[0xc] = in_XMM1_Bo;
      auVar19[0xd] = in_XMM1_Bp;
      auVar17[1] = in_XMM1_Be;
      auVar17[0] = in_XMM1_Bd;
      auVar17[2] = in_XMM1_Bf;
      auVar17[3] = in_XMM1_Bg;
      auVar17[4] = in_XMM1_Bh;
      auVar17[5] = in_XMM1_Bi;
      auVar17[6] = in_XMM1_Bj;
      auVar17[7] = in_XMM1_Bk;
      auVar17[8] = in_XMM1_Bl;
      auVar17[9] = in_XMM1_Bm;
      auVar17[10] = in_XMM1_Bn;
      auVar17[0xb] = in_XMM1_Bo;
      auVar17[0xc] = in_XMM1_Bp;
      auVar15[1] = in_XMM1_Bf;
      auVar15[0] = in_XMM1_Be;
      auVar15[2] = in_XMM1_Bg;
      auVar15[3] = in_XMM1_Bh;
      auVar15[4] = in_XMM1_Bi;
      auVar15[5] = in_XMM1_Bj;
      auVar15[6] = in_XMM1_Bk;
      auVar15[7] = in_XMM1_Bl;
      auVar15[8] = in_XMM1_Bm;
      auVar15[9] = in_XMM1_Bn;
      auVar15[10] = in_XMM1_Bo;
      auVar15[0xb] = in_XMM1_Bp;
      auVar13[1] = in_XMM1_Bg;
      auVar13[0] = in_XMM1_Bf;
      auVar13[2] = in_XMM1_Bh;
      auVar13[3] = in_XMM1_Bi;
      auVar13[4] = in_XMM1_Bj;
      auVar13[5] = in_XMM1_Bk;
      auVar13[6] = in_XMM1_Bl;
      auVar13[7] = in_XMM1_Bm;
      auVar13[8] = in_XMM1_Bn;
      auVar13[9] = in_XMM1_Bo;
      auVar13[10] = in_XMM1_Bp;
      uVar24 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar19 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar17 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar15 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar4 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      pptVar26 = pptVar26 + uVar4;
      cVar1 = pcVar25[uVar4];
      pcVar25 = pcVar25 + uVar4;
    }
    sVar3 = (value->
            super_raw_hash_map<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
            ).
            super_raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
            .capacity_;
    if (pcVar25 != pcVar2 + sVar3) {
      lVar27 = 0;
      do {
        value_00 = *pptVar26;
        if (lVar27 != 0) {
          local_210._M_dataplus._M_p._0_1_ = 0x2c;
          std::__ostream_insert<char,std::char_traits<char>>(poVar23,(char *)&local_210,1);
          if (lVar27 == 0x20) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar23," ...",4);
            goto LAB_0011fa3b;
          }
        }
        local_210._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,(char *)&local_210,1);
        UniversalPrint<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>
                  (value_00,poVar23);
        pptVar26 = pptVar26 + 1;
        cVar1 = pcVar25[1];
        pcVar25 = pcVar25 + 1;
        while (cVar1 < -1) {
          iVar9 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                         == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))
                                    ));
          iVar10 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                          == CONCAT13(in_XMM1_Bh,
                                      CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
          iVar11 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                          == CONCAT13(in_XMM1_Bl,
                                      CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
          iVar12 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                          == CONCAT13(in_XMM1_Bp,
                                      CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
          in_XMM1_Ba = -(*pcVar25 < (char)iVar9);
          in_XMM1_Bb = -(pcVar25[1] < (char)((uint)iVar9 >> 8));
          in_XMM1_Bc = -(pcVar25[2] < (char)((uint)iVar9 >> 0x10));
          in_XMM1_Bd = -(pcVar25[3] < (char)((uint)iVar9 >> 0x18));
          in_XMM1_Be = -(pcVar25[4] < (char)iVar10);
          in_XMM1_Bf = -(pcVar25[5] < (char)((uint)iVar10 >> 8));
          in_XMM1_Bg = -(pcVar25[6] < (char)((uint)iVar10 >> 0x10));
          in_XMM1_Bh = -(pcVar25[7] < (char)((uint)iVar10 >> 0x18));
          in_XMM1_Bi = -(pcVar25[8] < (char)iVar11);
          in_XMM1_Bj = -(pcVar25[9] < (char)((uint)iVar11 >> 8));
          in_XMM1_Bk = -(pcVar25[10] < (char)((uint)iVar11 >> 0x10));
          in_XMM1_Bl = -(pcVar25[0xb] < (char)((uint)iVar11 >> 0x18));
          in_XMM1_Bm = -(pcVar25[0xc] < (char)iVar12);
          in_XMM1_Bn = -(pcVar25[0xd] < (char)((uint)iVar12 >> 8));
          in_XMM1_Bo = -(pcVar25[0xe] < (char)((uint)iVar12 >> 0x10));
          in_XMM1_Bp = -(pcVar25[0xf] < (char)((uint)iVar12 >> 0x18));
          auVar7[1] = in_XMM1_Bb;
          auVar7[0] = in_XMM1_Ba;
          auVar7[2] = in_XMM1_Bc;
          auVar7[3] = in_XMM1_Bd;
          auVar7[4] = in_XMM1_Be;
          auVar7[5] = in_XMM1_Bf;
          auVar7[6] = in_XMM1_Bg;
          auVar7[7] = in_XMM1_Bh;
          auVar7[8] = in_XMM1_Bi;
          auVar7[9] = in_XMM1_Bj;
          auVar7[10] = in_XMM1_Bk;
          auVar7[0xb] = in_XMM1_Bl;
          auVar7[0xc] = in_XMM1_Bm;
          auVar7[0xd] = in_XMM1_Bn;
          auVar7[0xe] = in_XMM1_Bo;
          auVar7[0xf] = in_XMM1_Bp;
          auVar8[1] = in_XMM1_Bb;
          auVar8[0] = in_XMM1_Ba;
          auVar8[2] = in_XMM1_Bc;
          auVar8[3] = in_XMM1_Bd;
          auVar8[4] = in_XMM1_Be;
          auVar8[5] = in_XMM1_Bf;
          auVar8[6] = in_XMM1_Bg;
          auVar8[7] = in_XMM1_Bh;
          auVar8[8] = in_XMM1_Bi;
          auVar8[9] = in_XMM1_Bj;
          auVar8[10] = in_XMM1_Bk;
          auVar8[0xb] = in_XMM1_Bl;
          auVar8[0xc] = in_XMM1_Bm;
          auVar8[0xd] = in_XMM1_Bn;
          auVar8[0xe] = in_XMM1_Bo;
          auVar8[0xf] = in_XMM1_Bp;
          auVar20[1] = in_XMM1_Bd;
          auVar20[0] = in_XMM1_Bc;
          auVar20[2] = in_XMM1_Be;
          auVar20[3] = in_XMM1_Bf;
          auVar20[4] = in_XMM1_Bg;
          auVar20[5] = in_XMM1_Bh;
          auVar20[6] = in_XMM1_Bi;
          auVar20[7] = in_XMM1_Bj;
          auVar20[8] = in_XMM1_Bk;
          auVar20[9] = in_XMM1_Bl;
          auVar20[10] = in_XMM1_Bm;
          auVar20[0xb] = in_XMM1_Bn;
          auVar20[0xc] = in_XMM1_Bo;
          auVar20[0xd] = in_XMM1_Bp;
          auVar18[1] = in_XMM1_Be;
          auVar18[0] = in_XMM1_Bd;
          auVar18[2] = in_XMM1_Bf;
          auVar18[3] = in_XMM1_Bg;
          auVar18[4] = in_XMM1_Bh;
          auVar18[5] = in_XMM1_Bi;
          auVar18[6] = in_XMM1_Bj;
          auVar18[7] = in_XMM1_Bk;
          auVar18[8] = in_XMM1_Bl;
          auVar18[9] = in_XMM1_Bm;
          auVar18[10] = in_XMM1_Bn;
          auVar18[0xb] = in_XMM1_Bo;
          auVar18[0xc] = in_XMM1_Bp;
          auVar16[1] = in_XMM1_Bf;
          auVar16[0] = in_XMM1_Be;
          auVar16[2] = in_XMM1_Bg;
          auVar16[3] = in_XMM1_Bh;
          auVar16[4] = in_XMM1_Bi;
          auVar16[5] = in_XMM1_Bj;
          auVar16[6] = in_XMM1_Bk;
          auVar16[7] = in_XMM1_Bl;
          auVar16[8] = in_XMM1_Bm;
          auVar16[9] = in_XMM1_Bn;
          auVar16[10] = in_XMM1_Bo;
          auVar16[0xb] = in_XMM1_Bp;
          auVar14[1] = in_XMM1_Bg;
          auVar14[0] = in_XMM1_Bf;
          auVar14[2] = in_XMM1_Bh;
          auVar14[3] = in_XMM1_Bi;
          auVar14[4] = in_XMM1_Bj;
          auVar14[5] = in_XMM1_Bk;
          auVar14[6] = in_XMM1_Bl;
          auVar14[7] = in_XMM1_Bm;
          auVar14[8] = in_XMM1_Bn;
          auVar14[9] = in_XMM1_Bo;
          auVar14[10] = in_XMM1_Bp;
          uVar24 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB141(auVar20 >> 7,0) & 1) << 2 |
                            (ushort)(SUB131(auVar18 >> 7,0) & 1) << 3 |
                            (ushort)(SUB121(auVar16 >> 7,0) & 1) << 4 |
                            (ushort)(SUB111(auVar14 >> 7,0) & 1) << 5 |
                            (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                     CONCAT18(in_XMM1_Bo,
                                                              CONCAT17(in_XMM1_Bn,
                                                                       CONCAT16(in_XMM1_Bm,
                                                                                CONCAT15(in_XMM1_Bl,
                                                                                         CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                            (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                     CONCAT17(in_XMM1_Bo,
                                                              CONCAT16(in_XMM1_Bn,
                                                                       CONCAT15(in_XMM1_Bm,
                                                                                CONCAT14(in_XMM1_Bl,
                                                                                         CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                           7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
          uVar4 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          pptVar26 = pptVar26 + uVar4;
          cVar1 = pcVar25[uVar4];
          pcVar25 = pcVar25 + uVar4;
        }
        lVar27 = lVar27 + 1;
      } while (pcVar25 != pcVar2 + sVar3);
      if (lVar27 != 0) {
LAB_0011fa3b:
        local_210._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,(char *)&local_210,1);
      }
    }
    local_210._M_dataplus._M_p._0_1_ = 0x7d;
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,(char *)&local_210,1);
    GetTypeName_abi_cxx11_
              (&local_210,
               (internal *)
               &phmap::
                node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,int,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>
                ::typeinfo,type);
    pMVar21 = local_1f0;
    if ((local_210._M_string_length < 0x15) ||
       (lVar27 = std::__cxx11::string::find_first_of((char *)&local_210,0x1c0c1e,0), lVar27 == -1))
    {
      poVar23 = pMVar21->stream_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar23," (of type ",10);
      poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar23,(char *)CONCAT71(local_210._M_dataplus._M_p._1_7_,
                                                    local_210._M_dataplus._M_p._0_1_),
                           local_210._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar23,")",1);
    }
    std::__cxx11::stringbuf::str();
    poVar23 = pMVar21->stream_;
    if ((poVar23 != (ostream *)0x0) && (local_1e0 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar23,(char *)local_1e8,local_1e0);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_210._M_dataplus._M_p._1_7_,local_210._M_dataplus._M_p._0_1_) !=
        &local_210.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_210._M_dataplus._M_p._1_7_,local_210._M_dataplus._M_p._0_1_),
                      local_210.field_2._M_allocated_capacity + 1);
    }
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_002089b0;
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return bVar22;
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}